

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_item.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::get_item::get_item
          (get_item *this,node *dht_node,node_id *target,data_callback *dcallback,
          nodes_callback *ncallback)

{
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  local_50;
  nodes_callback *local_30;
  nodes_callback *ncallback_local;
  data_callback *dcallback_local;
  node_id *target_local;
  node *dht_node_local;
  get_item *this_local;
  
  local_30 = ncallback;
  ncallback_local = (nodes_callback *)dcallback;
  dcallback_local = (data_callback *)target;
  target_local = (node_id *)dht_node;
  dht_node_local = (node *)this;
  ::std::
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  ::function(&local_50,ncallback);
  find_data::find_data(&this->super_find_data,dht_node,target,&local_50);
  ::std::
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  ::~function(&local_50);
  (this->super_find_data).super_traversal_algorithm._vptr_traversal_algorithm =
       (_func_int **)&PTR__get_item_00b95c50;
  ::std::function<void_(const_libtorrent::dht::item_&,_bool)>::function
            (&this->m_data_callback,dcallback);
  item::item(&this->m_data);
  this->m_immutable = true;
  return;
}

Assistant:

get_item::get_item(
	node& dht_node
	, node_id const& target
	, data_callback dcallback
	, nodes_callback ncallback)
	: find_data(dht_node, target, std::move(ncallback))
	, m_data_callback(std::move(dcallback))
	, m_immutable(true)
{
}